

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.hpp
# Opt level: O0

void __thiscall helics::apps::SourceObject::SourceObject(SourceObject *this,Publication *p,Time per)

{
  Publication *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Publication *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = in_RDI;
  Publication::Publication(unaff_retaddr,in_RDX);
  in_RDI[6]._M_string_length = (size_type)in_RDX;
  in_RDI[6].field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&in_RDI[6].field_2 + 8) = 0xffffffff;
  std::__cxx11::string::string(this_00);
  return;
}

Assistant:

SourceObject(const Publication& p, Time per): pub(p), period(per) {}